

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

PointAttribute * __thiscall
draco::PointCloud::GetNamedAttributeByUniqueId(PointCloud *this,Type type,uint32_t unique_id)

{
  uint32_t uVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer pPVar4;
  vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
  *this_00;
  uint32_t in_EDX;
  int in_ESI;
  long in_RDI;
  size_t att_id;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28 + (long)in_ESI * 0x18));
    if (sVar2 <= local_20) {
      return (PointAttribute *)0x0;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28 + (long)in_ESI * 0x18),
                        local_20);
    std::
    vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  *)(in_RDI + 0x10),(long)*pvVar3);
    pPVar4 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
             operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         *)0x1c63a9);
    uVar1 = GeometryAttribute::unique_id(&pPVar4->super_GeometryAttribute);
    if (uVar1 == in_EDX) break;
    local_20 = local_20 + 1;
  }
  this_00 = (vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             *)(in_RDI + 0x10);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28 + (long)in_ESI * 0x18),
                      local_20);
  std::
  vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
  ::operator[](this_00,(long)*pvVar3);
  pPVar4 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::get
                     ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       *)this_00);
  return pPVar4;
}

Assistant:

const PointAttribute *PointCloud::GetNamedAttributeByUniqueId(
    GeometryAttribute::Type type, uint32_t unique_id) const {
  for (size_t att_id = 0; att_id < named_attribute_index_[type].size();
       ++att_id) {
    if (attributes_[named_attribute_index_[type][att_id]]->unique_id() ==
        unique_id) {
      return attributes_[named_attribute_index_[type][att_id]].get();
    }
  }
  return nullptr;
}